

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::HandleSharedDependency(cmComputeLinkDepends *this,SharedDepEntry *dep)

{
  _Rb_tree_color _Var1;
  pointer pLVar2;
  cmGeneratorTarget *this_00;
  iterator iVar3;
  cmLinkInterface *iface;
  cmGraphEdge local_30;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LinkEntryIndex)._M_t,(key_type *)dep);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar3._M_node = (_Base_ptr)AllocateLinkEntry(this,(string *)dep);
    _Var1 = iVar3._M_node[2]._M_color;
    pLVar2 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_assign((string *)(pLVar2 + (int)_Var1));
    pLVar2[(int)_Var1].Target = (dep->Item).Target;
    pLVar2[(int)_Var1].IsSharedDep = true;
  }
  _Var1 = iVar3._M_node[2]._M_color;
  pLVar2 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_30.Strong = true;
  local_30.Dest = _Var1;
  std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
              super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
              super__Vector_impl_data._M_start[dep->DependerIndex].
              super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_30);
  this_00 = pLVar2[(int)_Var1].Target;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    iface = cmGeneratorTarget::GetLinkInterface(this_00,&this->Config,this->Target);
    if (iface != (cmLinkInterface *)0x0) {
      FollowSharedDeps(this,_Var1,iface,true);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::HandleSharedDependency(SharedDepEntry const& dep)
{
  // Check if the target already has an entry.
  std::map<std::string, int>::iterator lei =
    this->LinkEntryIndex.find(dep.Item);
  if(lei == this->LinkEntryIndex.end())
    {
    // Allocate a spot for the item entry.
    lei = this->AllocateLinkEntry(dep.Item);

    // Initialize the item entry.
    LinkEntry& entry = this->EntryList[lei->second];
    entry.Item = dep.Item;
    entry.Target = dep.Item.Target;

    // This item was added specifically because it is a dependent
    // shared library.  It may get special treatment
    // in cmComputeLinkInformation.
    entry.IsSharedDep = true;
    }

  // Get the link entry for this target.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];

  // This shared library dependency must follow the item that listed
  // it.
  this->EntryConstraintGraph[dep.DependerIndex].push_back(index);

  // Target items may have their own dependencies.
  if(entry.Target)
    {
    if(cmLinkInterface const* iface =
       entry.Target->GetLinkInterface(this->Config, this->Target))
      {
      // Follow public and private dependencies transitively.
      this->FollowSharedDeps(index, iface, true);
      }
    }
}